

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O2

bool wasm::optimizeBlock(Block *curr,Module *module,PassOptions *passOptions,
                        BranchSeekerCache *branchInfo)

{
  ExpressionList *this;
  char *pcVar1;
  Module *pMVar2;
  IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
  IVar3;
  Module *pMVar4;
  Expression *pEVar5;
  undefined1 uVar6;
  bool bVar7;
  undefined1 extraout_AL;
  uint uVar8;
  Expression **ppEVar9;
  Loop *pLVar10;
  Expression *pEVar11;
  undefined8 extraout_RAX;
  Drop *pDVar12;
  pointer ppEVar13;
  Expression *pEVar14;
  size_t j_1;
  size_t sVar15;
  long lVar16;
  Index j_2;
  ulong uVar17;
  ulong uVar18;
  Expression *index;
  uint uVar19;
  size_t j;
  Block *pBVar20;
  ulong index_00;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar21;
  IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
  IVar22;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Name target;
  Name target_00;
  undefined1 local_148 [8];
  SmallVector<wasm::Expression_*,_10UL> merged;
  Builder BStack_c8;
  Builder builder;
  Block *local_a0;
  Expression *child;
  Loop *local_90;
  Module *local_88;
  ulong local_80;
  Block *local_78;
  ulong local_70;
  size_t local_68;
  Block *local_60;
  Expression *local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  ulong local_48;
  ulong local_40;
  Expression *local_38;
  
  local_50 = &(curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  local_70 = 0;
  uVar17 = 1;
  merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)passOptions;
  child = (Expression *)branchInfo;
  local_88 = module;
  local_60 = curr;
LAB_00a8dc63:
  uVar6 = (undefined1)uVar17;
  if ((uVar17 & 1) == 0) {
    if ((local_70 & 1) != 0) {
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
      Block::finalize(curr,type__01,Unknown);
      uVar6 = extraout_AL;
    }
    return (bool)uVar6;
  }
  index_00 = 0;
  uVar18 = 1;
  local_80 = 0;
LAB_00a8dc7a:
  pAVar21 = local_50;
  uVar17 = local_80;
  if (index_00 <
      (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements) {
    ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (local_50,index_00);
    pBVar20 = (Block *)*ppEVar9;
    local_a0 = pBVar20;
    if ((pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id == BlockId
       ) {
      pLVar10 = (Loop *)0x0;
LAB_00a8dca6:
      pEVar14 = (Expression *)
                (pBVar20->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
      local_68 = index_00;
      if (pEVar14 != (Expression *)0x0) {
        this = &pBVar20->list;
        pEVar11 = (Expression *)0x1;
        local_90 = pLVar10;
        local_78 = pBVar20;
        do {
          if (pEVar14 <= pEVar11) {
            pcVar1 = (local_78->name).super_IString.str._M_str;
            local_48 = 0;
            if (pcVar1 == (char *)0x0) {
              local_38 = (Expression *)((ulong)pEVar14 & 0xffffffff);
              goto LAB_00a8de05;
            }
            curr = local_60;
            index_00 = local_68;
            if ((local_78->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                id < 2) {
              sVar15 = (local_78->name).super_IString.str._M_len;
              pEVar11 = (Expression *)0x0;
              local_40 = uVar18;
              goto LAB_00a8ddb6;
            }
            break;
          }
          ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(size_t)((long)&pEVar11[-1].type.id + 7));
          pEVar11 = (Expression *)&pEVar11->field_0x1;
          index_00 = local_68;
        } while (((*ppEVar9)->type).id != 1);
      }
    }
    else {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAVar21,index_00);
      pDVar12 = (Drop *)*ppEVar9;
      if ((pDVar12->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id ==
          DropId) {
        pBVar20 = (Block *)pDVar12->value;
        if (((pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
             BlockId) &&
           (ppEVar13 = merged.flexible.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
           bVar7 = optimizeDroppedBlock
                             (pDVar12,pBVar20,local_88,
                              (PassOptions *)
                              merged.flexible.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (BranchSeekerCache *)child), bVar7)) {
          ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (local_50,index_00);
          *ppEVar9 = (Expression *)pBVar20;
          local_70 = CONCAT71((int7)((ulong)ppEVar9 >> 8),1);
          pLVar10 = (Loop *)0x0;
          local_80 = CONCAT71((int7)((ulong)ppEVar13 >> 8),1);
          local_a0 = pBVar20;
          goto LAB_00a8dca6;
        }
      }
      else {
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (pAVar21,index_00);
        pLVar10 = (Loop *)*ppEVar9;
        if (((pLVar10->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression._id ==
             LoopId) &&
           (pBVar20 = (Block *)pLVar10->body,
           (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
           BlockId)) goto LAB_00a8dca6;
      }
    }
    goto LAB_00a8dec4;
  }
  goto LAB_00a8dc63;
LAB_00a8ddb6:
  if (pEVar14 == pEVar11) goto LAB_00a8dded;
  ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                      (&this->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (size_t)pEVar11);
  target.super_IString.str._M_str = pcVar1;
  target.super_IString.str._M_len = sVar15;
  bVar7 = BranchUtils::BranchSeekerCache::hasBranch((BranchSeekerCache *)child,*ppEVar9,target);
  if (bVar7) {
    local_48 = (ulong)pEVar14 & 0xffffffff;
    uVar18 = local_40;
    local_38 = pEVar11;
    goto LAB_00a8de05;
  }
  pEVar11 = (Expression *)&pEVar11->field_0x1;
  goto LAB_00a8ddb6;
LAB_00a8dded:
  local_38 = (Expression *)((ulong)pEVar14 & 0xffffffff);
  uVar18 = local_40;
LAB_00a8de05:
  if (local_90 == (Loop *)0x0) {
    pEVar11 = (Expression *)(local_48 & 0xffffffff);
  }
  else {
    pEVar11 = (Expression *)(local_90->name).super_IString.str._M_len;
    pcVar1 = (local_90->name).super_IString.str._M_str;
    uVar17 = (ulong)pEVar14 & 0xffffffff;
    uVar19 = (int)pEVar14 + 1;
    local_58 = pEVar11;
    local_40 = uVar18;
    do {
      uVar17 = uVar17 - 1;
      if ((int)(uint)uVar17 < 0) goto LAB_00a8de80;
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)((uint)uVar17 & 0x7fffffff));
      target_00.super_IString.str._M_str = (char *)pEVar11;
      target_00.super_IString.str._M_len = (size_t)pcVar1;
      bVar7 = BranchUtils::BranchSeeker::has((BranchSeeker *)*ppEVar9,local_58,target_00);
      uVar19 = uVar19 - 1;
    } while (!bVar7);
    uVar8 = (uint)local_48;
    local_48 = local_48 & 0xffffffff;
    if (uVar8 < uVar19) {
      local_48 = (ulong)uVar19;
    }
    local_38 = (Expression *)0x0;
LAB_00a8de80:
    uVar18 = local_40;
    pEVar11 = (Expression *)(local_48 & 0xffffffff);
    if ((pEVar11 < pEVar14) &&
       (ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&this->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ), curr = local_60, index_00 = local_68, 1 < ((*ppEVar9)->type).id))
    goto LAB_00a8dec4;
  }
  if (((int)local_38 != 0) || (curr = local_60, index_00 = local_68, pEVar14 != pEVar11)) {
    local_148 = (undefined1  [8])0x0;
    merged.fixed._M_elems[9] = (Expression *)0x0;
    merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58 = pEVar11;
    for (sVar15 = 0; local_68 != sVar15; sVar15 = sVar15 + 1) {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (local_50,sVar15);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)local_148,ppEVar9);
    }
    index = (Expression *)((ulong)local_38 & 0xffffffff);
    local_40 = uVar18;
    for (pEVar11 = (Expression *)0x0; index != pEVar11; pEVar11 = (Expression *)&pEVar11->field_0x1)
    {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(size_t)pEVar11);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)local_148,ppEVar9);
    }
    uVar17 = local_40;
    pBVar20 = local_60;
    pAVar21 = local_50;
    if ((uint)local_38 < (uint)local_48) {
      pEVar11 = (Expression *)&local_a0;
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)local_148,(Expression **)pEVar11);
      pEVar5 = local_58;
      pBVar20 = local_60;
      BStack_c8.wasm = (Module *)0x0;
      builder.wasm = (Module *)0x0;
      for (; index < pEVar5; index = (Expression *)&index->field_0x1) {
        ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)index);
        pEVar11 = *ppEVar9;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   &stack0xffffffffffffff38,pEVar11);
      }
      for (uVar17 = local_48; (Expression *)(uVar17 & 0xffffffff) < pEVar14;
          uVar17 = (ulong)((int)uVar17 + 1)) {
        pEVar11 = (Expression *)
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(size_t)(uVar17 & 0xffffffff));
        SmallVector<wasm::Expression_*,_10UL>::push_back
                  ((SmallVector<wasm::Expression_*,_10UL> *)local_148,(Expression **)pEVar11);
      }
      pMVar2 = (Module *)
               (local_78->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)BStack_c8.wasm;
      pMVar4 = (Module *)
               (local_78->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = (size_t)builder.wasm;
      (local_78->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar11;
      BStack_c8.wasm = pMVar2;
      builder.wasm = pMVar4;
      Block::finalize(local_78,type_,Unknown);
      uVar17 = local_40;
      pAVar21 = local_50;
      if (local_90 != (Loop *)0x0) {
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar11;
        Loop::finalize(local_90,type__00);
        uVar17 = local_40;
        pAVar21 = local_50;
      }
    }
    for (; uVar17 < (pBVar20->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements; uVar17 = uVar17 + 1) {
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAVar21,uVar17);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)local_148,ppEVar9);
    }
    if (((long)merged.flexible.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start - (long)merged.fixed._M_elems[9] >> 3) +
        (long)local_148 != 0) {
      ppEVar9 = SmallVector<wasm::Expression_*,_10UL>::back
                          ((SmallVector<wasm::Expression_*,_10UL> *)local_148);
      local_58 = *ppEVar9;
      IVar22 = (IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                )SmallVector<wasm::Expression_*,_10UL>::end
                           ((SmallVector<wasm::Expression_*,_10UL> *)local_148);
      lVar16 = -0x50;
      pEVar14 = local_58;
      for (uVar17 = 0; IVar3.index = uVar17,
          IVar3.parent = (SmallVector<wasm::Expression_*,_10UL> *)local_148, IVar22 != IVar3;
          uVar17 = uVar17 + 1) {
        pEVar11 = (Expression *)(merged.fixed._M_elems + 9);
        if (9 < uVar17) {
          pEVar11 = merged.fixed._M_elems[9];
        }
        if ((*(Expression **)(&pEVar11->_id + lVar16) != pEVar14) &&
           (1 < ((*(Expression **)(&pEVar11->_id + lVar16))->type).id)) {
          BStack_c8.wasm = local_88;
          pDVar12 = Builder::makeDrop(&stack0xffffffffffffff38,
                                      *(Expression **)(&pEVar11->_id + lVar16));
          *(Drop **)(&pEVar11->_id + lVar16) = pDVar12;
          pEVar14 = local_58;
        }
        lVar16 = lVar16 + 8;
      }
    }
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<wasm::SmallVector<wasm::Expression*,10ul>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)local_50,
               (SmallVector<wasm::Expression_*,_10UL> *)local_148);
    curr = local_60;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               (merged.fixed._M_elems + 9));
    local_70 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    uVar17 = 1;
    goto LAB_00a8dc63;
  }
LAB_00a8dec4:
  index_00 = index_00 + 1;
  uVar18 = uVar18 + 1;
  goto LAB_00a8dc7a;
}

Assistant:

static bool optimizeBlock(Block* curr,
                          Module* module,
                          PassOptions& passOptions,
                          BranchUtils::BranchSeekerCache& branchInfo) {
  auto& list = curr->list;
  // Main merging loop.
  bool more = true;
  bool changed = false;
  while (more) {
    more = false;
    for (size_t i = 0; i < list.size(); i++) {
      auto* child = list[i];
      // The child block, if there is one.
      Block* childBlock = child->dynCast<Block>();
      // If we are merging an inner block of a loop, then we must not
      // merge things before and including the name of the loop, moving
      // those out would break things.
      Loop* loop = nullptr;
      // To to handle a non-block child.
      if (!childBlock) {
        // If we have a child that is (drop (block ..)) then we can move the
        // drop into the block, and remove br values. This allows more merging.
        if (auto* drop = list[i]->dynCast<Drop>()) {
          childBlock = drop->value->dynCast<Block>();
          if (childBlock &&
              optimizeDroppedBlock(
                drop, childBlock, *module, passOptions, branchInfo)) {
            child = list[i] = childBlock;
            more = true;
            changed = true;
          } else {
            childBlock = nullptr;
          }
        } else if ((loop = list[i]->dynCast<Loop>())) {
          // We can merge a loop's "tail" - if the body is a block and has
          // instructions at the end that do not branch back.
          childBlock = loop->body->dynCast<Block>();
          // TODO: handle (loop (loop - the bodies of loops may not be blocks
        }
      }
      // If no block, we can't do anything.
      if (!childBlock) {
        continue;
      }
      auto& childList = childBlock->list;
      auto childSize = childList.size();
      if (childSize == 0) {
        continue;
      }
      // If the child has items after an unreachable, ignore it - dce should
      // have been run, and we prefer to not handle the complexity here.
      if (hasDeadCode(childBlock)) {
        continue;
      }
      // In some cases we can remove only the head or the tail of the block,
      // and must keep some things in the child block.
      Index keepStart = childSize;
      Index keepEnd = 0;
      // For a block with a name, we may only be able to remove a head, up
      // to the first item that branches to the block.
      if (childBlock->name.is()) {
        // If it has a concrete value, then breaks may be sending it a value,
        // and we'd need to handle that. TODO
        if (childBlock->type.isConcrete()) {
          continue;
        }
        auto childName = childBlock->name;
        for (size_t j = 0; j < childSize; j++) {
          auto* item = childList[j];
          if (branchInfo.hasBranch(item, childName)) {
            // We can't remove this from the child.
            keepStart = j;
            keepEnd = childSize;
            break;
          }
        }
      }
      // For a loop, we may only be able to remove a tail
      if (loop) {
        auto childName = loop->name;
        for (auto j = int(childSize - 1); j >= 0; j--) {
          auto* item = childList[j];
          if (BranchUtils::BranchSeeker::has(item, childName)) {
            // We can't remove this from the child.
            keepStart = 0;
            keepEnd = std::max(Index(j + 1), keepEnd);
            break;
          }
        }
        // If we can only do part of the block, and if the block has a flowing
        // value, we would need special handling for that - not worth it,
        // probably TODO
        // FIXME is this not handled by the drop later down?
        if (keepEnd < childSize && childList.back()->type.isConcrete()) {
          continue;
        }
      }
      // Maybe there's nothing to do, if we must keep it all in the
      // child anyhow.
      if (keepStart == 0 && keepEnd == childSize) {
        continue;
      }
      // There is something to do!
      bool keepingPart = keepStart < keepEnd;
      // Create a new merged list, and fill in the code before the child block
      // we are merging in. It is efficient to use a small vector here because
      // most blocks are fairly small, and this way we copy once into the arena
      // we use for Block lists a single time at the end (arena allocations
      // can't be freed, so any temporary allocations while we add to the list
      // would end up wasted).
      SmallVector<Expression*, 10> merged;
      for (size_t j = 0; j < i; j++) {
        merged.push_back(list[j]);
      }
      // Add the head of the block - the things at the start we do
      // not need to keep.
      for (Index j = 0; j < keepStart; j++) {
        merged.push_back(childList[j]);
      }
      // If we can't merge it all, keep and filter the child.
      if (keepingPart) {
        merged.push_back(child);
        // Filter the child.
        ExpressionList filtered(module->allocator);
        for (Index j = keepStart; j < keepEnd; j++) {
          filtered.push_back(childList[j]);
        }
        // Add the tail of the block - the things at the end we do
        // not need to keep.
        for (Index j = keepEnd; j < childSize; j++) {
          merged.push_back(childList[j]);
        }
        // Update the child.
        childList.swap(filtered);
        // We may have removed unreachable items.
        childBlock->finalize();
        if (loop) {
          loop->finalize();
        }
        // Note that we modify the child block here, which invalidates info
        // in branchInfo. However, as we have scanned the parent, we have
        // already forgotten the child's info, so there is nothing to do here
        // for the child.
        // (We also don't need to do anything for the parent - we move code
        // from a child into the parent, but that doesn't change the total
        // branches in the parent.)
      }
      // Add the rest of the parent block after the child.
      for (size_t j = i + 1; j < list.size(); j++) {
        merged.push_back(list[j]);
      }
      // if we merged a concrete element in the middle, drop it
      if (!merged.empty()) {
        auto* last = merged.back();
        for (auto*& item : merged) {
          if (item != last && item->type.isConcrete()) {
            Builder builder(*module);
            item = builder.makeDrop(item);
          }
        }
      }
      list.set(merged);
      more = true;
      changed = true;
      break;
    }
  }
  if (changed) {
    curr->finalize(curr->type);
  }
  return changed;
}